

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_zip.c
# Opt level: O3

zip_source_t *
zip_source_zip_create
          (zip_t *srcza,zip_uint64_t srcidx,zip_flags_t flags,zip_uint64_t start,zip_int64_t len,
          zip_error_t *error)

{
  ulong len_00;
  zip_source_t *pzVar1;
  
  if (len < -1) {
    zip_error_set(error,0x12,0);
    return (zip_source_t *)0x0;
  }
  len_00 = -(ulong)(len == 0) | len;
  pzVar1 = zip_source_zip_file_create
                     (srcza,srcidx,
                      (flags & 0xfffffffb) + (uint)(len_00 == 0xffffffffffffffff && start == 0) * 4,
                      start,len_00,(char *)0x0,error);
  return pzVar1;
}

Assistant:

ZIP_EXTERN zip_source_t *zip_source_zip_create(zip_t *srcza, zip_uint64_t srcidx, zip_flags_t flags, zip_uint64_t start, zip_int64_t len, zip_error_t *error) {
    if (len < -1) {
        zip_error_set(error, ZIP_ER_INVAL, 0);
        return NULL;
    }
    
    if (len == 0) {
        len = -1;
    }
    
    if (start == 0 && len == -1) {
        flags |= ZIP_FL_COMPRESSED;
    }
    else {
        flags &= ~ZIP_FL_COMPRESSED;
    }

    return zip_source_zip_file_create(srcza, srcidx, flags, start, len, NULL, error);
}